

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateSubBlockSize
                 (BYTE *literals,size_t litSize,BYTE *ofCodeTable,BYTE *llCodeTable,
                 BYTE *mlCodeTable,size_t nbSeq,ZSTD_entropyCTables_t *entropy,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize,
                 int writeLitEntropy,int writeSeqEntropy)

{
  size_t sVar1;
  size_t sVar2;
  ZSTD_fseCTablesMetadata_t *in_RCX;
  ZSTD_fseCTables_t *in_RDX;
  size_t in_RSI;
  BYTE *in_RDI;
  void *in_R8;
  size_t in_R9;
  BYTE *unaff_retaddr;
  BYTE *in_stack_00000008;
  int in_stack_00000010;
  size_t cSizeEstimate;
  
  sVar1 = ZSTD_estimateSubBlockSize_literal
                    (in_RDI,in_RSI,(ZSTD_hufCTables_t *)in_RDX,(ZSTD_hufCTablesMetadata_t *)in_RCX,
                     in_R8,in_R9,in_stack_00000010);
  sVar2 = ZSTD_estimateSubBlockSize_sequences
                    (in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,
                     (void *)cSizeEstimate,nbSeq,(int)mlCodeTable);
  return sVar2 + sVar1 + 3;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize(const BYTE* literals, size_t litSize,
                                        const BYTE* ofCodeTable,
                                        const BYTE* llCodeTable,
                                        const BYTE* mlCodeTable,
                                        size_t nbSeq,
                                        const ZSTD_entropyCTables_t* entropy,
                                        const ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                        void* workspace, size_t wkspSize,
                                        int writeLitEntropy, int writeSeqEntropy) {
    size_t cSizeEstimate = 0;
    cSizeEstimate += ZSTD_estimateSubBlockSize_literal(literals, litSize,
                                                         &entropy->huf, &entropyMetadata->hufMetadata,
                                                         workspace, wkspSize, writeLitEntropy);
    cSizeEstimate += ZSTD_estimateSubBlockSize_sequences(ofCodeTable, llCodeTable, mlCodeTable,
                                                         nbSeq, &entropy->fse, &entropyMetadata->fseMetadata,
                                                         workspace, wkspSize, writeSeqEntropy);
    return cSizeEstimate + ZSTD_blockHeaderSize;
}